

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureCases.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Performance::Texture2DRenderCase::~Texture2DRenderCase(Texture2DRenderCase *this)

{
  ~Texture2DRenderCase(this);
  operator_delete(this,0x220);
  return;
}

Assistant:

Texture2DRenderCase::~Texture2DRenderCase (void)
{
	for (vector<glu::Texture2D*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
		delete *i;
	m_textures.clear();
}